

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
          (Stack<Shell::Options::AbstractOptionValue_*> *this,
          Stack<Shell::Options::AbstractOptionValue_*> *s)

{
  AbstractOptionValue **ppAVar1;
  Stack<Shell::Options::AbstractOptionValue_*> *in_RSI;
  Stack<Shell::Options::AbstractOptionValue_*> *in_RDI;
  void *mem;
  BottomFirstIterator in_stack_ffffffffffffffd8;
  
  in_RDI->_capacity = in_RSI->_capacity;
  if (in_RDI->_capacity == 0) {
    in_RDI->_stack = (AbstractOptionValue **)0x0;
  }
  else {
    ppAVar1 = (AbstractOptionValue **)Lib::alloc((size_t)in_RDI);
    in_RDI->_stack = ppAVar1;
  }
  in_RDI->_cursor = in_RDI->_stack;
  in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
  BottomFirstIterator::BottomFirstIterator((BottomFirstIterator *)&stack0xffffffffffffffd8,in_RSI);
  Stack<Shell::Options::AbstractOptionValue*>::
  loadFromIterator<Lib::Stack<Shell::Options::AbstractOptionValue*>::BottomFirstIterator>
            (in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }